

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void jsonReplaceFunc(sqlite3_context *ctx,int argc,sqlite3_value **argv)

{
  int iVar1;
  uchar *puVar2;
  JsonNode *pJVar3;
  uint local_64;
  u32 i;
  char *zPath;
  JsonNode *pNode;
  JsonParse x;
  sqlite3_value **argv_local;
  int argc_local;
  sqlite3_context *ctx_local;
  
  if (0 < argc) {
    x._40_8_ = argv;
    if ((argc & 1U) == 0) {
      jsonWrongNumArgs(ctx,"replace");
    }
    else {
      puVar2 = sqlite3_value_text(*argv);
      iVar1 = jsonParse((JsonParse *)&pNode,ctx,(char *)puVar2);
      if (iVar1 == 0) {
        for (local_64 = 1; local_64 < (uint)argc; local_64 = local_64 + 2) {
          puVar2 = sqlite3_value_text(*(sqlite3_value **)(x._40_8_ + (ulong)local_64 * 8));
          pJVar3 = jsonLookup((JsonParse *)&pNode,(char *)puVar2,(int *)0x0,ctx);
          if (x.aUp._1_1_ != '\0') goto LAB_00272cbc;
          if (pJVar3 != (JsonNode *)0x0) {
            pJVar3->jnFlags = pJVar3->jnFlags | 8;
            (pJVar3->u).iAppend = local_64 + 1;
          }
        }
        if ((*(byte *)(x._0_8_ + 1) & 8) == 0) {
          jsonReturnJson((JsonNode *)x._0_8_,ctx,(sqlite3_value **)x._40_8_);
        }
        else {
          sqlite3_result_value
                    (ctx,*(sqlite3_value **)(x._40_8_ + (ulong)*(uint *)(x._0_8_ + 8) * 8));
        }
LAB_00272cbc:
        jsonParseReset((JsonParse *)&pNode);
      }
    }
  }
  return;
}

Assistant:

static void jsonReplaceFunc(
  sqlite3_context *ctx,
  int argc,
  sqlite3_value **argv
){
  JsonParse x;          /* The parse */
  JsonNode *pNode;
  const char *zPath;
  u32 i;

  if( argc<1 ) return;
  if( (argc&1)==0 ) {
    jsonWrongNumArgs(ctx, "replace");
    return;
  }
  if( jsonParse(&x, ctx, (const char*)sqlite3_value_text(argv[0])) ) return;
  assert( x.nNode );
  for(i=1; i<(u32)argc; i+=2){
    zPath = (const char*)sqlite3_value_text(argv[i]);
    pNode = jsonLookup(&x, zPath, 0, ctx);
    if( x.nErr ) goto replace_err;
    if( pNode ){
      assert( pNode->eU==0 || pNode->eU==1 || pNode->eU==4 );
      testcase( pNode->eU!=0 && pNode->eU!=1 );
      pNode->jnFlags |= (u8)JNODE_REPLACE;
      VVA( pNode->eU =  4 );
      pNode->u.iReplace = i + 1;
    }
  }
  if( x.aNode[0].jnFlags & JNODE_REPLACE ){
    assert( x.aNode[0].eU==4 );
    sqlite3_result_value(ctx, argv[x.aNode[0].u.iReplace]);
  }else{
    jsonReturnJson(x.aNode, ctx, argv);
  }
replace_err:
  jsonParseReset(&x);
}